

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall QWidgetTextControlPrivate::startDrag(QWidgetTextControlPrivate *this)

{
  QPointer<QWidget> *this_00;
  long *plVar1;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  QDrag *this_01;
  QObject *pQVar5;
  QObject *pQVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  
  plVar1 = *(long **)&this->field_0x8;
  this->mousePressed = false;
  this_00 = &this->contextWidget;
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar3) {
    (**(code **)(*plVar1 + 0x98))(plVar1);
    this_01 = (QDrag *)operator_new(0x10);
    pDVar2 = (this_00->wp).d;
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar5 = (QObject *)0x0;
    }
    else {
      pQVar5 = (this->contextWidget).wp.value;
    }
    QDrag::QDrag(this_01,pQVar5);
    QDrag::setMimeData((QMimeData *)this_01);
    if (((this->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
         super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) == 0) {
      uVar7 = 1;
      uVar8 = 1;
    }
    else {
      uVar8 = 3;
      uVar7 = 2;
    }
    iVar4 = QDrag::exec(this_01,uVar8,uVar7);
    if (iVar4 == 2) {
      pQVar5 = (QObject *)QDrag::target();
      pDVar2 = (this_00->wp).d;
      if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
        pQVar6 = (QObject *)0x0;
      }
      else {
        pQVar6 = (this->contextWidget).wp.value;
      }
      if (pQVar6 != pQVar5) {
        QTextCursor::removeSelectedText();
        return;
      }
    }
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::startDrag()
{

#ifdef Q_OS_WASM
    // QDrag::exec() will crash without asyncify; disable drag instead.
    if (!qstdweb::haveAsyncify())
        return;
#endif

#if QT_CONFIG(draganddrop)
    Q_Q(QWidgetTextControl);
    mousePressed = false;
    if (!contextWidget)
        return;
    QMimeData *data = q->createMimeDataFromSelection();

    QDrag *drag = new QDrag(contextWidget);
    drag->setMimeData(data);

    Qt::DropActions actions = Qt::CopyAction;
    Qt::DropAction action;
    if (interactionFlags & Qt::TextEditable) {
        actions |= Qt::MoveAction;
        action = drag->exec(actions, Qt::MoveAction);
    } else {
        action = drag->exec(actions, Qt::CopyAction);
    }

    if (action == Qt::MoveAction && drag->target() != contextWidget)
        cursor.removeSelectedText();
#endif
}